

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::Phase
          (Phase<std::complex<double>_> *this,real_type cos,real_type sin)

{
  real_type sin_local;
  real_type cos_local;
  Phase<std::complex<double>_> *this_local;
  
  QGate1<std::complex<double>_>::QGate1(&this->super_QGate1<std::complex<double>_>,0);
  QAdjustable::QAdjustable
            ((QAdjustable *)&(this->super_QGate1<std::complex<double>_>).field_0xc,false);
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016adc0;
  QAngle<double>::QAngle(&this->angle_,cos,sin);
  return;
}

Assistant:

Phase( const real_type cos , const real_type sin )
        : QGate1< T >( 0 )
        , angle_( cos , sin )
        , QAdjustable( false )
        { }